

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,VectorBase<double> *param_2,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *param_5,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  double dVar2;
  VarStatus VVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  VarStatus *pVVar8;
  char *pcVar9;
  bool *pbVar10;
  int __c;
  int __c_00;
  int __c_01;
  long in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  int i_1;
  int k_1;
  bool haveSetBasis;
  int k;
  int rIdx;
  int rIdx_new;
  int i;
  int in_stack_fffffffffffffecc;
  VectorBase<double> *in_stack_fffffffffffffed0;
  uint local_4c;
  uint local_44;
  int local_38;
  
  if ((*(byte *)(in_RDI + 0x42) & 1) != 0) {
    local_38 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0xa0));
    while (local_38 = local_38 + -1, -1 < local_38) {
      piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xa0),local_38);
      if (-1 < *piVar6) {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xa0),local_38);
        iVar5 = *piVar6;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1;
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,iVar5);
        VVar3 = *pVVar8;
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,local_38);
        *pVVar8 = VVar3;
      }
    }
  }
  for (local_44 = 0; iVar5 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0x50)),
      (int)local_44 < iVar5; local_44 = local_44 + 1) {
    pcVar9 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0x50),(char *)(ulong)local_44,__c);
    if ((int)pcVar9 != *(int *)(in_RDI + 0x28)) {
      pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      dVar1 = *pdVar7;
      pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_44);
      dVar2 = *pdVar7;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0x50),(char *)(ulong)local_44,__c_00);
      pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      *pdVar7 = dVar1 / dVar2;
    }
  }
  bVar4 = false;
  for (local_4c = 0; iVar5 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0x50)),
      (int)local_4c < iVar5; local_4c = local_4c + 1) {
    pcVar9 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0x50),(char *)(ulong)local_4c,__c_01);
    iVar5 = (int)pcVar9;
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)(in_RDI + 0x28));
    if ((*pVVar8 == BASIC) || ((bVar4 && (iVar5 != *(int *)(in_RDI + 0x28))))) {
      pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x70),local_4c);
      dVar1 = *pdVar7;
      pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      *pdVar7 = dVar1;
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,iVar5);
      *pVVar8 = BASIC;
    }
    else {
      pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,*(int *)(in_RDI + 0x28));
      if ((*pVVar8 == FIXED) &&
         ((iVar5 == *(int *)(in_RDI + 0x38) || (iVar5 == *(int *)(in_RDI + 0x3c))))) {
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar7;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
        dVar2 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1 * dVar2;
        dVar1 = *(double *)(in_RDI + 0x30);
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1;
        pbVar10 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0xb8),local_4c);
        if ((*pbVar10 & 1U) == 0) {
          if (iVar5 == *(int *)(in_RDI + 0x38)) {
            pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
            dVar1 = *pdVar7;
            pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),0);
            dVar2 = *pdVar7;
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (in_stack_00000008,iVar5);
            *pVVar8 = (uint)(0.0 < dVar1 * dVar2);
          }
          else {
            pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
            dVar1 = *pdVar7;
            pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),0);
            dVar2 = *pdVar7;
            pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (in_stack_00000008,iVar5);
            *pVVar8 = (uint)(dVar1 * dVar2 <= 0.0);
          }
        }
        else {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_stack_00000008,iVar5);
          *pVVar8 = FIXED;
        }
        if (iVar5 != *(int *)(in_RDI + 0x28)) {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_stack_00000008,*(int *)(in_RDI + 0x28));
          *pVVar8 = BASIC;
        }
        bVar4 = true;
      }
      else if ((iVar5 == *(int *)(in_RDI + 0x38)) &&
              (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                  (in_stack_00000008,*(int *)(in_RDI + 0x28)), *pVVar8 == ON_LOWER))
      {
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar7;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
        dVar2 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1 * dVar2;
        dVar1 = *(double *)(in_RDI + 0x30);
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
        dVar1 = *pdVar7;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),0);
        dVar2 = *pdVar7;
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,iVar5);
        *pVVar8 = (uint)(0.0 < dVar1 * dVar2);
        if (iVar5 != *(int *)(in_RDI + 0x28)) {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_stack_00000008,*(int *)(in_RDI + 0x28));
          *pVVar8 = BASIC;
        }
        bVar4 = true;
      }
      else if ((iVar5 == *(int *)(in_RDI + 0x3c)) &&
              (pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                  (in_stack_00000008,*(int *)(in_RDI + 0x28)), *pVVar8 == ON_UPPER))
      {
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar7;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
        dVar2 = *pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1 * dVar2;
        dVar1 = *(double *)(in_RDI + 0x30);
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = dVar1;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),local_4c);
        dVar1 = *pdVar7;
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x50),0);
        dVar2 = *pdVar7;
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,iVar5);
        *pVVar8 = (uint)(dVar1 * dVar2 <= 0.0);
        if (iVar5 != *(int *)(in_RDI + 0x28)) {
          pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_stack_00000008,*(int *)(in_RDI + 0x28));
          *pVVar8 = BASIC;
        }
        bVar4 = true;
      }
      else if (iVar5 != *(int *)(in_RDI + 0x28)) {
        pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x70),local_4c);
        in_stack_fffffffffffffed0 = (VectorBase<double> *)*pdVar7;
        pdVar7 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        *pdVar7 = (double)in_stack_fffffffffffffed0;
        pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,iVar5);
        *pVVar8 = BASIC;
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}